

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorArraySum_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLchar *array_name,
          GLuint columns,GLuint size)

{
  InitializerListTest *this_00;
  long lVar1;
  ulong uVar2;
  size_t position;
  string name;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = 1;
  for (lVar1 = 0; (ulong)columns * 8 - lVar1 != 0; lVar1 = lVar1 + 8) {
    position = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,array_name,(allocator<char> *)&local_50);
    this_00 = (InitializerListTest *)&position;
    Utils::replaceToken("INDEX",(size_t *)this_00,*(GLchar **)((long)getVectorArraySum::lut + lVar1)
                        ,&name);
    getVectorSum_abi_cxx11_(&local_50,this_00,name._M_dataplus._M_p,size);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    if (uVar2 < columns) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&name);
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorArraySum(const GLchar* array_name, GLuint columns, GLuint size)
{
	static const GLchar* lut[] = { "0", "1", "2", "3" };

	std::string sum;

	for (GLuint i = 0; i < columns; ++i)
	{
		size_t		position = 0;
		std::string name	 = array_name;

		Utils::replaceToken("INDEX", position, lut[i], name);

		sum.append(getVectorSum(name.c_str(), size));

		if (i + 1 < columns)
		{
			sum.append(" + ");
		}
	}

	return sum;
}